

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmodule.cpp
# Opt level: O3

Ref __thiscall trun::TestModule::TestCaseFromName(TestModule *this,string *caseName)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  _func_int **pp_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __n;
  long *plVar5;
  Ref RVar6;
  
  plVar1 = (long *)caseName[0xb].field_2._M_allocated_capacity;
  __n._M_pi = in_RDX;
  for (plVar5 = (long *)caseName[0xb]._M_string_length; plVar5 != plVar1; plVar5 = plVar5 + 2) {
    pp_Var4 = (_func_int **)*plVar5;
    this->_vptr_TestModule = pp_Var4;
    lVar2 = plVar5[1];
    *(long *)&this->state = lVar2;
    if (lVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        UNLOCK();
        pp_Var4 = this->_vptr_TestModule;
      }
      else {
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      }
    }
    __n._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var4[9];
    if ((__n._M_pi == *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDX->_M_use_count) &&
       ((__n._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
        (iVar3 = bcmp(pp_Var4[8],in_RDX->_vptr__Sp_counted_base,(size_t)__n._M_pi),
        __n._M_pi = extraout_RDX, iVar3 == 0)))) goto LAB_00162405;
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->state !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->state);
      __n._M_pi = extraout_RDX_00;
    }
  }
  this->_vptr_TestModule = (_func_int **)0x0;
  *(undefined8 *)&this->state = 0;
LAB_00162405:
  RVar6.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = __n._M_pi
  ;
  RVar6.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ref)RVar6.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestFunc::Ref TestModule::TestCaseFromName(const std::string &caseName) const {
    for (auto func: testFuncs) {
        if (func->CaseName() == caseName) {
            return func;
        }
    }
    return nullptr;
}